

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O1

void ncnn::im2col_sgemm_pack1to4_int8_sse_avx2
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  uint uVar1;
  void *pvVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  int *piVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  undefined1 *puVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  undefined1 (*pauVar21) [16];
  long lVar22;
  undefined1 (*pauVar23) [16];
  uint uVar24;
  size_t _elemsize;
  long lVar25;
  ulong *puVar26;
  long lVar27;
  long lVar28;
  undefined1 (*pauVar29) [16];
  int iVar30;
  undefined1 *puVar31;
  long lVar32;
  int iVar33;
  long lVar34;
  long lVar35;
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar37 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  long local_c8;
  Mat local_b8;
  ulong local_70;
  ulong local_68;
  Mat *local_60;
  Mat *local_58;
  ulong local_50;
  ulong local_48;
  long local_40;
  Mat *local_38;
  
  uVar1 = bottom_im2col->w;
  iVar33 = bottom_im2col->h;
  uVar24 = bottom_im2col->c;
  lVar34 = (long)(int)uVar24;
  local_68 = (ulong)(uint)top_blob->c;
  local_b8.cstep = 0;
  local_b8.data = (void *)0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.elemsize = 0;
  local_b8.elempack = 0;
  local_b8.allocator = (Allocator *)0x0;
  local_b8.dims = 0;
  local_b8.w = 0;
  local_b8.h = 0;
  local_b8.d = 0;
  local_b8.c = 0;
  uVar10 = uVar1;
  iVar19 = iVar33;
  if (lVar34 < 4) {
    uVar14 = uVar24;
    if ((int)uVar1 < 4) {
      iVar30 = 1;
      _elemsize = 1;
      if ((int)uVar1 < 2) goto LAB_0025a6ea;
      iVar19 = iVar33 * 2;
      uVar10 = (uVar1 & 1) + 1;
    }
    else {
      uVar10 = (uVar1 & 1) + (uVar1 >> 2) + (uint)((uVar1 >> 1 & 1) != 0);
      iVar19 = iVar33 * 4;
    }
    iVar30 = 1;
    _elemsize = 1;
  }
  else {
    if ((int)uVar1 < 4) {
      if ((int)uVar1 < 2) {
        iVar30 = 4;
        _elemsize = 4;
        uVar14 = (uVar24 & 3) + (uVar24 >> 2);
        goto LAB_0025a6ea;
      }
      iVar19 = iVar33 * 2;
      uVar14 = (uVar24 & 3) + (uVar24 >> 2);
      uVar10 = (uVar1 & 1) + 1;
    }
    else {
      iVar19 = iVar33 * 4;
      uVar14 = (uVar24 & 3) + (uVar24 >> 2);
      uVar10 = (uVar1 & 1) + (uVar1 >> 2) + (uint)((uVar1 >> 1 & 1) != 0);
    }
    iVar30 = 4;
    _elemsize = 4;
  }
LAB_0025a6ea:
  local_60 = top_blob;
  local_58 = kernel;
  Mat::create(&local_b8,iVar19,uVar14,uVar10,_elemsize,iVar30,opt->workspace_allocator);
  local_70 = (ulong)uVar24;
  uVar11 = (ulong)(int)uVar1;
  uVar10 = (int)uVar1 >> 2;
  if (0 < (int)uVar10) {
    local_50 = (ulong)uVar10;
    local_c8 = 3;
    lVar27 = 1;
    uVar17 = 0;
    do {
      puVar31 = (undefined1 *)(local_b8.cstep * uVar17 * local_b8.elemsize + (long)local_b8.data);
      if ((int)uVar24 < 4) {
        uVar16 = 0;
      }
      else {
        lVar32 = 3;
        lVar15 = 2;
        lVar35 = 1;
        uVar20 = 0;
        do {
          if (0 < iVar33) {
            lVar22 = bottom_im2col->elemsize * bottom_im2col->cstep;
            lVar25 = lVar22 * lVar32;
            lVar12 = (long)bottom_im2col->data + local_c8;
            lVar18 = lVar22 * lVar15;
            lVar28 = lVar22 * uVar20;
            lVar22 = lVar22 * lVar35;
            iVar19 = iVar33;
            do {
              *puVar31 = *(undefined1 *)(lVar12 + -3 + lVar28);
              puVar31[1] = *(undefined1 *)(lVar12 + -3 + lVar22);
              puVar31[2] = *(undefined1 *)(lVar12 + -3 + lVar18);
              puVar31[3] = *(undefined1 *)(lVar12 + -3 + lVar25);
              puVar31[4] = *(undefined1 *)(lVar12 + -2 + lVar28);
              puVar31[5] = *(undefined1 *)(lVar12 + -2 + lVar22);
              puVar31[6] = *(undefined1 *)(lVar12 + -2 + lVar18);
              puVar31[7] = *(undefined1 *)(lVar12 + -2 + lVar25);
              puVar31[8] = *(undefined1 *)(lVar12 + -1 + lVar28);
              puVar31[9] = *(undefined1 *)(lVar12 + -1 + lVar22);
              puVar31[10] = *(undefined1 *)(lVar12 + -1 + lVar18);
              puVar31[0xb] = *(undefined1 *)(lVar12 + -1 + lVar25);
              puVar31[0xc] = *(undefined1 *)(lVar12 + lVar28);
              puVar31[0xd] = *(undefined1 *)(lVar12 + lVar22);
              puVar31[0xe] = *(undefined1 *)(lVar12 + lVar18);
              puVar31[0xf] = *(undefined1 *)(lVar12 + lVar25);
              puVar31 = puVar31 + 0x10;
              lVar12 = lVar12 + uVar11;
              iVar19 = iVar19 + -1;
            } while (iVar19 != 0);
          }
          uVar16 = uVar20 + 4;
          lVar12 = uVar20 + 7;
          lVar32 = lVar32 + 4;
          lVar15 = lVar15 + 4;
          lVar35 = lVar35 + 4;
          uVar20 = uVar16;
          local_48 = uVar17;
          local_40 = lVar27;
        } while (lVar12 < lVar34);
      }
      if ((int)uVar16 < (int)uVar24) {
        uVar16 = uVar16 & 0xffffffff;
        do {
          if (0 < iVar33) {
            puVar13 = (undefined1 *)
                      ((long)bottom_im2col->data +
                      bottom_im2col->cstep * bottom_im2col->elemsize * uVar16 + lVar27);
            iVar19 = iVar33;
            do {
              *puVar31 = puVar13[-1];
              puVar31[1] = *puVar13;
              puVar31[2] = puVar13[1];
              puVar31[3] = puVar13[2];
              puVar31 = puVar31 + 4;
              puVar13 = puVar13 + uVar11;
              iVar19 = iVar19 + -1;
            } while (iVar19 != 0);
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != local_70);
      }
      uVar17 = uVar17 + 1;
      local_c8 = local_c8 + 4;
      lVar27 = lVar27 + 4;
    } while (uVar17 != local_50);
  }
  uVar17 = uVar11 & 0xfffffffffffffffc;
  uVar14 = uVar1 >> 1 & 1;
  if (uVar14 != 0) {
    puVar31 = (undefined1 *)
              ((long)(int)uVar10 * local_b8.cstep * local_b8.elemsize + (long)local_b8.data);
    uVar16 = 0;
    if (3 < (int)uVar24) {
      lVar27 = 1;
      lVar15 = 2;
      lVar32 = 3;
      uVar20 = 0;
      do {
        if (0 < iVar33) {
          pvVar2 = bottom_im2col->data;
          lVar12 = bottom_im2col->elemsize * bottom_im2col->cstep;
          lVar35 = (long)pvVar2 + lVar12 * uVar20 + 1;
          lVar22 = (long)pvVar2 + lVar12 * lVar27 + 1;
          lVar18 = (long)pvVar2 + lVar12 * lVar15 + 1;
          lVar12 = (long)pvVar2 + lVar12 * lVar32 + 1;
          iVar19 = iVar33;
          do {
            *puVar31 = *(undefined1 *)(lVar35 + -1 + uVar17);
            puVar31[1] = *(undefined1 *)(lVar22 + -1 + uVar17);
            puVar31[2] = *(undefined1 *)(lVar18 + -1 + uVar17);
            puVar31[3] = *(undefined1 *)(lVar12 + -1 + uVar17);
            puVar31[4] = *(undefined1 *)(lVar35 + uVar17);
            puVar31[5] = *(undefined1 *)(lVar22 + uVar17);
            puVar31[6] = *(undefined1 *)(lVar18 + uVar17);
            puVar31[7] = *(undefined1 *)(lVar12 + uVar17);
            puVar31 = puVar31 + 8;
            lVar35 = lVar35 + uVar11;
            lVar22 = lVar22 + uVar11;
            lVar18 = lVar18 + uVar11;
            lVar12 = lVar12 + uVar11;
            iVar19 = iVar19 + -1;
          } while (iVar19 != 0);
        }
        uVar16 = uVar20 + 4;
        lVar35 = uVar20 + 7;
        lVar27 = lVar27 + 4;
        lVar15 = lVar15 + 4;
        lVar32 = lVar32 + 4;
        uVar20 = uVar16;
      } while (lVar35 < lVar34);
    }
    if ((int)uVar16 < (int)uVar24) {
      uVar16 = uVar16 & 0xffffffff;
      do {
        if (0 < iVar33) {
          puVar13 = (undefined1 *)
                    ((long)bottom_im2col->data +
                    bottom_im2col->cstep * bottom_im2col->elemsize * uVar16 + uVar17 + 1);
          iVar19 = iVar33;
          do {
            *puVar31 = puVar13[-1];
            puVar31[1] = *puVar13;
            puVar31 = puVar31 + 2;
            puVar13 = puVar13 + uVar11;
            iVar19 = iVar19 + -1;
          } while (iVar19 != 0);
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 != local_70);
    }
  }
  iVar19 = (int)uVar17 + uVar14 * 2;
  if (iVar19 < (int)uVar1) {
    uVar17 = (ulong)iVar19;
    do {
      uVar10 = (uint)uVar17;
      uVar14 = uVar10 + 3;
      if (-1 < (int)uVar10) {
        uVar14 = uVar10;
      }
      puVar31 = (undefined1 *)
                (local_b8.elemsize * local_b8.cstep *
                 (long)(int)((uVar10 - (((uint)(uVar17 >> 0x1f) & 1) + uVar10 & 0xfffffffe)) +
                             ((int)uVar14 >> 2) + (int)(uVar10 - (uVar14 & 0xfffffffc)) / 2) +
                (long)local_b8.data);
      if ((int)uVar24 < 4) {
        uVar16 = 0;
      }
      else {
        lVar27 = 1;
        lVar15 = 2;
        lVar32 = 3;
        uVar20 = 0;
        do {
          if (0 < iVar33) {
            lVar35 = bottom_im2col->elemsize * bottom_im2col->cstep;
            lVar12 = (long)bottom_im2col->data + uVar17;
            iVar19 = iVar33;
            do {
              *puVar31 = *(undefined1 *)(lVar12 + lVar35 * uVar20);
              puVar31[1] = *(undefined1 *)(lVar12 + lVar35 * lVar27);
              puVar31[2] = *(undefined1 *)(lVar12 + lVar35 * lVar15);
              puVar31[3] = *(undefined1 *)(lVar12 + lVar35 * lVar32);
              puVar31 = puVar31 + 4;
              lVar12 = lVar12 + uVar11;
              iVar19 = iVar19 + -1;
            } while (iVar19 != 0);
          }
          uVar16 = uVar20 + 4;
          lVar35 = uVar20 + 7;
          lVar27 = lVar27 + 4;
          lVar15 = lVar15 + 4;
          lVar32 = lVar32 + 4;
          uVar20 = uVar16;
        } while (lVar35 < lVar34);
      }
      if ((int)uVar16 < (int)uVar24) {
        uVar16 = uVar16 & 0xffffffff;
        do {
          if (0 < iVar33) {
            puVar13 = (undefined1 *)
                      ((long)bottom_im2col->data +
                      uVar17 + bottom_im2col->cstep * uVar16 * bottom_im2col->elemsize);
            iVar19 = iVar33;
            do {
              *puVar31 = *puVar13;
              puVar31 = puVar31 + 1;
              puVar13 = puVar13 + uVar11;
              iVar19 = iVar19 + -1;
            } while (iVar19 != 0);
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != local_70);
      }
      uVar17 = uVar17 + 1;
      local_38 = bottom_im2col;
    } while (uVar17 != uVar11);
  }
  if (0 < (int)local_68) {
    uVar10 = uVar24 + 3;
    if (-1 < (int)uVar24) {
      uVar10 = uVar24;
    }
    iVar19 = ((int)uVar10 >> 2) * iVar33;
    iVar33 = ((int)uVar24 % 4) * iVar33;
    uVar17 = 0;
    do {
      pauVar21 = (undefined1 (*) [16])
                 (local_60->cstep * uVar17 * local_60->elemsize + (long)local_60->data);
      if ((int)uVar1 < 4) {
        uVar16 = 0;
      }
      else {
        uVar20 = 0;
        do {
          pauVar23 = (undefined1 (*) [16])
                     ((uVar20 >> 2) * local_b8.cstep * local_b8.elemsize + (long)local_b8.data);
          pauVar29 = (undefined1 (*) [16])
                     (local_58->cstep * uVar17 * local_58->elemsize + (long)local_58->data);
          auVar37 = ZEXT1664((undefined1  [16])0x0);
          if (iVar19 < 1) {
            auVar41 = ZEXT1664((undefined1  [16])0x0);
          }
          else {
            auVar41 = ZEXT1664((undefined1  [16])0x0);
            auVar42 = ZEXT1664((undefined1  [16])0x0);
            auVar44 = ZEXT1664((undefined1  [16])0x0);
            iVar30 = iVar19;
            do {
              auVar3 = vpmovsxbw_avx2(*pauVar23);
              auVar5 = vpermq_avx2(auVar3,0x50);
              auVar6 = vpermq_avx2(auVar3,0xfa);
              auVar4 = vpmovsxbw_avx2(*pauVar29);
              auVar7 = vpermq_avx2(auVar3,5);
              auVar8 = vpermq_avx2(auVar3,0xaf);
              auVar3 = vpmaddwd_avx2(auVar4,auVar5);
              auVar3 = vpaddd_avx2(auVar3,auVar37._0_32_);
              auVar37 = ZEXT3264(auVar3);
              auVar5 = vpmaddwd_avx2(auVar7,auVar4);
              auVar5 = vpaddd_avx2(auVar5,auVar42._0_32_);
              auVar42 = ZEXT3264(auVar5);
              auVar6 = vpmaddwd_avx2(auVar4,auVar6);
              auVar6 = vpaddd_avx2(auVar6,auVar41._0_32_);
              auVar41 = ZEXT3264(auVar6);
              auVar4 = vpmaddwd_avx2(auVar4,auVar8);
              auVar4 = vpaddd_avx2(auVar4,auVar44._0_32_);
              auVar44 = ZEXT3264(auVar4);
              pauVar23 = pauVar23 + 1;
              pauVar29 = pauVar29 + 1;
              iVar30 = iVar30 + -1;
            } while (iVar30 != 0);
            auVar3 = vphaddd_avx2(auVar3,auVar5);
            auVar5 = vphaddd_avx2(auVar6,auVar4);
            auVar3 = vpermq_avx2(auVar3,0x9c);
            auVar41 = ZEXT3264(auVar3);
            auVar3 = vpermq_avx2(auVar5,0x9c);
            auVar37 = ZEXT3264(auVar3);
          }
          auVar36 = auVar37._0_16_;
          auVar46 = auVar41._0_16_;
          auVar39 = auVar41._16_16_;
          auVar38 = auVar37._16_16_;
          if (0 < iVar33) {
            lVar34 = 0;
            do {
              auVar46 = vpmovsxbw_avx(ZEXT216(*(ushort *)(*pauVar23 + lVar34 * 4)));
              auVar46 = vpshuflw_avx(auVar46,0x50);
              auVar36 = vpshufd_avx(auVar46,0x50);
              auVar46 = vpmovsxbw_avx(ZEXT216(*(ushort *)(*pauVar23 + lVar34 * 4 + 2)));
              auVar46 = vpshuflw_avx(auVar46,0x50);
              auVar40 = vpshufd_avx(auVar46,0x50);
              auVar46 = vpmovsxbw_avx(ZEXT416(*(uint *)(*pauVar29 + lVar34 * 4)));
              auVar46._8_8_ = auVar46._0_8_;
              auVar43 = vpmullw_avx(auVar46,auVar36);
              auVar36 = vpmulhw_avx(auVar36,auVar46);
              auVar45 = vpmullw_avx(auVar46,auVar40);
              auVar40 = vpmulhw_avx(auVar40,auVar46);
              auVar46 = vpunpcklwd_avx(auVar43,auVar36);
              auVar46 = vpaddd_avx(auVar41._0_16_,auVar46);
              auVar41 = ZEXT1664(auVar46);
              auVar36 = vpunpckhwd_avx(auVar43,auVar36);
              auVar39 = vpaddd_avx(auVar39,auVar36);
              auVar36 = vpunpcklwd_avx(auVar45,auVar40);
              auVar36 = vpaddd_avx(auVar37._0_16_,auVar36);
              auVar37 = ZEXT1664(auVar36);
              auVar40 = vpunpckhwd_avx(auVar45,auVar40);
              auVar38 = vpaddd_avx(auVar38,auVar40);
              lVar34 = lVar34 + 1;
            } while (iVar33 != (int)lVar34);
          }
          *pauVar21 = auVar46;
          pauVar21[1] = auVar39;
          pauVar21[2] = auVar36;
          pauVar21[3] = auVar38;
          pauVar21 = pauVar21 + 4;
          uVar16 = uVar20 + 4;
          lVar34 = uVar20 + 7;
          uVar20 = uVar16;
        } while (lVar34 < (long)uVar11);
      }
      uVar24 = (uint)uVar16 | 1;
      while (uVar10 = (uint)uVar16, (int)uVar24 < (int)uVar1) {
        pauVar23 = (undefined1 (*) [16])
                   (local_b8.elemsize * local_b8.cstep *
                    (ulong)(((uint)(uVar16 >> 2) & 0x3fffffff) + (uint)((uVar10 >> 1 & 1) != 0)) +
                   (long)local_b8.data);
        pauVar29 = (undefined1 (*) [16])
                   (local_58->cstep * uVar17 * local_58->elemsize + (long)local_58->data);
        auVar37 = ZEXT1664((undefined1  [16])0x0);
        if (0 < iVar19) {
          auVar41 = ZEXT1664((undefined1  [16])0x0);
          iVar30 = iVar19;
          do {
            auVar3 = vpmovsxbw_avx2(*pauVar23);
            auVar6 = vpermq_avx2(auVar3,0x50);
            auVar5 = vpmovsxbw_avx2(*pauVar29);
            auVar4 = vpermq_avx2(auVar3,5);
            auVar3 = vpmaddwd_avx2(auVar6,auVar5);
            auVar3 = vpaddd_avx2(auVar3,auVar41._0_32_);
            auVar41 = ZEXT3264(auVar3);
            auVar5 = vpmaddwd_avx2(auVar4,auVar5);
            auVar5 = vpaddd_avx2(auVar5,auVar37._0_32_);
            auVar37 = ZEXT3264(auVar5);
            pauVar23 = (undefined1 (*) [16])(*pauVar23 + 8);
            pauVar29 = pauVar29 + 1;
            iVar30 = iVar30 + -1;
          } while (iVar30 != 0);
          auVar3 = vphaddd_avx2(auVar3,auVar5);
          auVar3 = vpermq_avx2(auVar3,0x9c);
          auVar37 = ZEXT3264(auVar3);
        }
        auVar46 = auVar37._0_16_;
        auVar39 = auVar37._16_16_;
        if (0 < iVar33) {
          lVar34 = 0;
          do {
            auVar46 = vpmovsxbw_avx(ZEXT216(*(ushort *)(*pauVar23 + lVar34 * 2)));
            auVar46 = vpshuflw_avx(auVar46,0x50);
            auVar40 = vpshufd_avx(auVar46,0x50);
            auVar36._8_8_ = 0;
            auVar36._0_8_ = *(ulong *)(*pauVar29 + lVar34 * 4);
            auVar46 = vpmovsxbw_avx(auVar36);
            auVar43._0_8_ = auVar46._0_8_;
            auVar43._8_8_ = auVar43._0_8_;
            auVar38 = vpmullw_avx(auVar40,auVar43);
            auVar36 = vpmulhw_avx(auVar40,auVar43);
            auVar46 = vpunpcklwd_avx(auVar38,auVar36);
            auVar46 = vpaddd_avx(auVar37._0_16_,auVar46);
            auVar37 = ZEXT1664(auVar46);
            auVar36 = vpunpckhwd_avx(auVar38,auVar36);
            auVar39 = vpaddd_avx(auVar39,auVar36);
            lVar34 = lVar34 + 1;
          } while (iVar33 != (int)lVar34);
        }
        *pauVar21 = auVar46;
        pauVar21[1] = auVar39;
        pauVar21 = pauVar21 + 2;
        uVar16 = (ulong)(uVar10 + 2);
        uVar24 = uVar10 + 3;
      }
      if ((int)uVar10 < (int)uVar1) {
        do {
          uVar24 = (uint)uVar16;
          puVar26 = (ulong *)(local_b8.elemsize * local_b8.cstep *
                              (ulong)((uVar24 & 1) + ((uint)(uVar16 >> 2) & 0x3fffffff) +
                                     (uint)((uVar24 >> 1 & 1) != 0)) + (long)local_b8.data);
          pauVar23 = (undefined1 (*) [16])
                     (local_58->cstep * uVar17 * local_58->elemsize + (long)local_58->data);
          auVar37 = ZEXT1664((undefined1  [16])0x0);
          if (0 < iVar19) {
            auVar41 = ZEXT1664((undefined1  [16])0x0);
            auVar42 = ZEXT1664((undefined1  [16])0x0);
            auVar44 = ZEXT1664((undefined1  [16])0x0);
            iVar30 = iVar19;
            do {
              auVar39._8_8_ = 0;
              auVar39._0_8_ = *puVar26;
              auVar36 = vpmovsxbw_avx(auVar39);
              auVar46 = *pauVar23;
              auVar39 = vpcmpgtb_avx((undefined1  [16])0x0,auVar46);
              auVar38 = vpunpcklbw_avx(auVar46,auVar39);
              auVar46 = vpunpckhbw_avx(auVar46,auVar39);
              auVar45._0_8_ = auVar36._0_8_;
              auVar45._8_8_ = auVar45._0_8_;
              auVar36 = vpmullw_avx(auVar38,auVar45);
              auVar39 = vpmulhw_avx(auVar38,auVar45);
              auVar40 = vpmullw_avx(auVar45,auVar46);
              auVar38 = vpmulhw_avx(auVar45,auVar46);
              auVar46 = vpunpcklwd_avx(auVar36,auVar39);
              auVar46 = vpaddd_avx(auVar44._0_16_,auVar46);
              auVar44 = ZEXT1664(auVar46);
              auVar39 = vpunpckhwd_avx(auVar36,auVar39);
              auVar39 = vpaddd_avx(auVar42._0_16_,auVar39);
              auVar42 = ZEXT1664(auVar39);
              auVar36 = vpunpcklwd_avx(auVar40,auVar38);
              auVar36 = vpaddd_avx(auVar41._0_16_,auVar36);
              auVar41 = ZEXT1664(auVar36);
              auVar38 = vpunpckhwd_avx(auVar40,auVar38);
              auVar38 = vpaddd_avx(auVar37._0_16_,auVar38);
              auVar37 = ZEXT1664(auVar38);
              puVar26 = (ulong *)((long)puVar26 + 4);
              pauVar23 = pauVar23 + 1;
              iVar30 = iVar30 + -1;
            } while (iVar30 != 0);
            auVar40 = vpunpckldq_avx(auVar46,auVar39);
            auVar43 = vpunpckldq_avx(auVar36,auVar38);
            auVar39 = vpunpckhdq_avx(auVar46,auVar39);
            auVar36 = vpunpckhdq_avx(auVar36,auVar38);
            auVar38 = vpunpcklqdq_avx(auVar40,auVar43);
            auVar46 = vpunpckhqdq_avx(auVar40,auVar43);
            auVar46 = vpaddd_avx(auVar38,auVar46);
            auVar38 = vpunpcklqdq_avx(auVar39,auVar36);
            auVar39 = vpunpckhqdq_avx(auVar39,auVar36);
            auVar39 = vpaddd_avx(auVar39,auVar38);
            auVar46 = vpaddd_avx(auVar46,auVar39);
            auVar37 = ZEXT1664(auVar46);
          }
          auVar46 = auVar37._0_16_;
          if (0 < iVar33) {
            lVar34 = 0;
            do {
              auVar40._0_2_ = (short)*(char *)((long)puVar26 + lVar34);
              auVar40._2_2_ = auVar40._0_2_;
              auVar40._4_2_ = auVar40._0_2_;
              auVar40._6_2_ = auVar40._0_2_;
              auVar40._8_2_ = auVar40._0_2_;
              auVar40._10_2_ = auVar40._0_2_;
              auVar40._12_2_ = auVar40._0_2_;
              auVar40._14_2_ = auVar40._0_2_;
              auVar38._8_8_ = 0;
              auVar38._0_8_ = *(ulong *)(*pauVar23 + lVar34 * 4);
              auVar46 = vpmovsxbw_avx(auVar38);
              auVar39 = vpmullw_avx(auVar40,auVar46);
              auVar46 = vpmulhw_avx(auVar40,auVar46);
              auVar46 = vpunpcklwd_avx(auVar39,auVar46);
              auVar46 = vpaddd_avx(auVar37._0_16_,auVar46);
              auVar37 = ZEXT1664(auVar46);
              lVar34 = lVar34 + 1;
            } while (iVar33 != (int)lVar34);
          }
          *pauVar21 = auVar46;
          pauVar21 = pauVar21 + 1;
          uVar16 = (ulong)(uVar24 + 1);
        } while (uVar24 + 1 != uVar1);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != local_68);
  }
  piVar9 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        if (local_b8.data != (void *)0x0) {
          free(local_b8.data);
        }
      }
      else {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

void im2col_sgemm_pack1to4_int8_sse_avx2(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    im2col_sgemm_pack1to4_int8_sse(bottom_im2col, top_blob, kernel, opt);
}